

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::AppendFromSelf
          (SnappyIOVecWriter *this,size_t offset,size_t len,char **param_3)

{
  size_t sVar1;
  char *pcVar2;
  char tmp_1 [8];
  iovec *piVar3;
  size_t sVar4;
  iovec *piVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  iovec *piVar11;
  char *pcVar12;
  char *pcVar13;
  void *__src;
  ulong __n;
  bool bVar14;
  ulong local_48;
  
  if (this->total_written_ <= offset - 1) {
    return false;
  }
  if (this->output_limit_ - this->total_written_ < len) {
LAB_010f75ed:
    bVar14 = false;
  }
  else {
    sVar6 = this->curr_iov_remaining_;
    piVar3 = this->curr_iov_;
    uVar8 = this->curr_iov_->iov_len - sVar6;
    do {
      sVar4 = uVar8 - offset;
      piVar11 = piVar3;
      if (offset <= uVar8) break;
      piVar11 = piVar3 + -1;
      offset = offset - uVar8;
      sVar4 = piVar3[-1].iov_len;
      piVar3 = piVar11;
      uVar8 = sVar4;
    } while (offset != 0);
    bVar14 = true;
    sVar7 = sVar6;
    if (len != 0) {
      do {
        if (piVar11 == this->curr_iov_) {
          piVar3 = this->curr_iov_;
          while (piVar5 = piVar3 + 1, sVar6 == 0) {
            if (this->output_iov_end_ <= piVar5) goto LAB_010f75ed;
            this->curr_iov_ = piVar5;
            this->curr_iov_output_ = (char *)piVar5->iov_base;
            sVar6 = piVar3[1].iov_len;
            this->curr_iov_remaining_ = sVar6;
            sVar7 = sVar6;
            piVar3 = piVar5;
            if (piVar5 != piVar11) goto LAB_010f7643;
          }
          local_48 = len;
          if (sVar6 < len) {
            local_48 = sVar6;
          }
          puVar9 = (undefined8 *)((long)piVar11->iov_base + sVar4);
          pcVar2 = this->curr_iov_output_;
          pcVar13 = pcVar2 + local_48;
          pcVar12 = pcVar2;
          if (7 < (ulong)((long)pcVar2 - (long)puVar9)) goto LAB_010f7775;
          uVar8 = (long)pcVar2 - (long)puVar9;
          if (pcVar2 + (sVar6 - 0xb) < pcVar2) {
            if (0 < (long)local_48) {
              uVar8 = 0;
              do {
                pcVar2[uVar8] = *(char *)((long)puVar9 + uVar8);
                uVar8 = uVar8 + 1;
              } while (local_48 != uVar8);
            }
          }
          else {
            do {
              *(undefined8 *)pcVar12 = *puVar9;
              pcVar12 = pcVar12 + uVar8;
              bVar14 = uVar8 < 4;
              uVar8 = uVar8 * 2;
            } while (bVar14);
            if (pcVar12 < pcVar13) {
LAB_010f7775:
              if (pcVar2 + (sVar6 - 0xf) < pcVar13) {
                AppendFromSelf();
              }
              else {
                *(undefined8 *)pcVar12 = *puVar9;
                *(undefined8 *)(pcVar12 + 8) = puVar9[1];
                if (pcVar12 + 0x10 < pcVar13) {
                  *(undefined8 *)(pcVar12 + 0x10) = puVar9[2];
                  *(undefined8 *)(pcVar12 + 0x18) = puVar9[3];
                }
                if (pcVar12 + 0x20 < pcVar13) {
                  *(undefined8 *)(pcVar12 + 0x20) = puVar9[4];
                  *(undefined8 *)(pcVar12 + 0x28) = puVar9[5];
                }
                if (pcVar12 + 0x30 < pcVar13) {
                  *(undefined8 *)(pcVar12 + 0x30) = puVar9[6];
                  *(undefined8 *)(pcVar12 + 0x38) = puVar9[7];
                }
              }
            }
          }
          this->curr_iov_output_ = this->curr_iov_output_ + local_48;
          sVar6 = this->curr_iov_remaining_ - local_48;
          this->curr_iov_remaining_ = sVar6;
          sVar4 = sVar4 + local_48;
          this->total_written_ = this->total_written_ + local_48;
          sVar7 = sVar6;
        }
        else {
LAB_010f7643:
          sVar1 = piVar11->iov_len;
          local_48 = sVar1 - sVar4;
          if (len < sVar1 - sVar4) {
            local_48 = len;
          }
          uVar8 = sVar1 - sVar4;
          if (sVar1 != sVar4) {
            __src = (void *)((long)piVar11->iov_base + sVar4);
            uVar10 = local_48;
            sVar6 = sVar7;
            do {
              if (sVar6 == 0) {
                piVar3 = this->curr_iov_;
                if (this->output_iov_end_ <= piVar3 + 1) {
                  sVar6 = 0;
                  sVar7 = 0;
                  break;
                }
                this->curr_iov_ = piVar3 + 1;
                pcVar13 = (char *)piVar3[1].iov_base;
                this->curr_iov_output_ = pcVar13;
                sVar6 = piVar3[1].iov_len;
                this->curr_iov_remaining_ = sVar6;
              }
              else {
                pcVar13 = this->curr_iov_output_;
              }
              __n = sVar6;
              if (uVar10 <= sVar6) {
                __n = uVar10;
              }
              switchD_00b041bd::default(pcVar13,__src,__n);
              this->curr_iov_output_ = this->curr_iov_output_ + __n;
              sVar6 = this->curr_iov_remaining_ - __n;
              this->curr_iov_remaining_ = sVar6;
              this->total_written_ = this->total_written_ + __n;
              __src = (void *)((long)__src + __n);
              uVar10 = uVar10 - __n;
              sVar7 = sVar6;
            } while (uVar10 != 0);
          }
          if (uVar8 < len) {
            sVar4 = 0;
          }
          piVar11 = piVar11 + (uVar8 < len);
        }
        len = len - local_48;
      } while (len != 0);
      bVar14 = true;
    }
  }
  return bVar14;
}

Assistant:

inline bool AppendFromSelf(size_t offset, size_t len, char**) {
    // See SnappyArrayWriter::AppendFromSelf for an explanation of
    // the "offset - 1u" trick.
    if (offset - 1u >= total_written_) {
      return false;
    }
    const size_t space_left = output_limit_ - total_written_;
    if (len > space_left) {
      return false;
    }

    // Locate the iovec from which we need to start the copy.
    const iovec* from_iov = curr_iov_;
    size_t from_iov_offset = curr_iov_->iov_len - curr_iov_remaining_;
    while (offset > 0) {
      if (from_iov_offset >= offset) {
        from_iov_offset -= offset;
        break;
      }

      offset -= from_iov_offset;
      --from_iov;
#if !defined(NDEBUG)
      assert(from_iov >= output_iov_);
#endif  // !defined(NDEBUG)
      from_iov_offset = from_iov->iov_len;
    }

    // Copy <len> bytes starting from the iovec pointed to by from_iov_index to
    // the current iovec.
    while (len > 0) {
      assert(from_iov <= curr_iov_);
      if (from_iov != curr_iov_) {
        const size_t to_copy =
            std::min(from_iov->iov_len - from_iov_offset, len);
        AppendNoCheck(GetIOVecPointer(from_iov, from_iov_offset), to_copy);
        len -= to_copy;
        if (len > 0) {
          ++from_iov;
          from_iov_offset = 0;
        }
      } else {
        size_t to_copy = curr_iov_remaining_;
        if (to_copy == 0) {
          // This iovec is full. Go to the next one.
          if (curr_iov_ + 1 >= output_iov_end_) {
            return false;
          }
          ++curr_iov_;
          curr_iov_output_ = reinterpret_cast<char*>(curr_iov_->iov_base);
          curr_iov_remaining_ = curr_iov_->iov_len;
          continue;
        }
        if (to_copy > len) {
          to_copy = len;
        }
        assert(to_copy > 0);

        IncrementalCopy(GetIOVecPointer(from_iov, from_iov_offset),
                        curr_iov_output_, curr_iov_output_ + to_copy,
                        curr_iov_output_ + curr_iov_remaining_);
        curr_iov_output_ += to_copy;
        curr_iov_remaining_ -= to_copy;
        from_iov_offset += to_copy;
        total_written_ += to_copy;
        len -= to_copy;
      }
    }

    return true;
  }